

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O1

void __thiscall
wabt::ExprVisitor::PushExprlist(ExprVisitor *this,State state,Expr *expr,ExprList *expr_list)

{
  pointer *pppEVar1;
  pointer *ppiVar2;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  State local_2c;
  Expr *local_28;
  iterator local_20;
  
  __position._M_current =
       (this->state_stack_).
       super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_2c = state;
  local_28 = expr;
  if (__position._M_current ==
      (this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::ExprVisitor::State,std::allocator<wabt::ExprVisitor::State>>::
    _M_realloc_insert<wabt::ExprVisitor::State&>
              ((vector<wabt::ExprVisitor::State,std::allocator<wabt::ExprVisitor::State>> *)
               &this->state_stack_,__position,&local_2c);
  }
  else {
    *__position._M_current = state;
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::Expr*,std::allocator<wabt::Expr*>>::_M_realloc_insert<wabt::Expr*&>
              ((vector<wabt::Expr*,std::allocator<wabt::Expr*>> *)&this->expr_stack_,__position_00,
               &local_28);
  }
  else {
    *__position_00._M_current = local_28;
    pppEVar1 = &(this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  local_20.node_ = expr_list->first_;
  __position_01._M_current =
       (this->expr_iter_stack_).
       super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.list_ = expr_list;
    std::
    vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ::_M_realloc_insert<wabt::intrusive_list<wabt::Expr>::iterator>
              (&this->expr_iter_stack_,__position_01,&local_20);
  }
  else {
    (__position_01._M_current)->list_ = expr_list;
    (__position_01._M_current)->node_ = local_20.node_;
    ppiVar2 = &(this->expr_iter_stack_).
               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppiVar2 = *ppiVar2 + 1;
  }
  return;
}

Assistant:

void ExprVisitor::PushExprlist(State state, Expr* expr, ExprList& expr_list) {
  state_stack_.emplace_back(state);
  expr_stack_.emplace_back(expr);
  expr_iter_stack_.emplace_back(expr_list.begin());
}